

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_Tree_load(HTS_Tree *tree,HTS_File *fp,HTS_Question *question)

{
  HTS_Boolean HVar1;
  int iVar2;
  uint uVar3;
  _HTS_Node *p_Var4;
  HTS_Node *buff_00;
  HTS_Question *pHVar5;
  size_t sVar6;
  long in_RSI;
  long in_RDI;
  HTS_Node *last_node;
  HTS_Node *node;
  char buff [1024];
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  undefined1 uVar7;
  size_t in_stack_fffffffffffffbc8;
  _HTS_Node *buff_01;
  char *in_stack_fffffffffffffbd0;
  HTS_File *in_stack_fffffffffffffbd8;
  HTS_Boolean local_1;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_1 = '\0';
  }
  else {
    HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    if (HVar1 == '\0') {
      HTS_Tree_clear((HTS_Tree *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
      local_1 = '\0';
    }
    else {
      p_Var4 = (_HTS_Node *)
               HTS_calloc(in_stack_fffffffffffffbc8,
                          CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
      HTS_Node_initialize(p_Var4);
      *(_HTS_Node **)(in_RDI + 0x10) = p_Var4;
      buff_00 = p_Var4;
      iVar2 = strcmp(&stack0xfffffffffffffbd8,"{");
      if (iVar2 == 0) {
        while( true ) {
          HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbd8,(char *)buff_00);
          uVar7 = false;
          if (HVar1 == '\x01') {
            iVar2 = strcmp(&stack0xfffffffffffffbd8,"}");
            uVar7 = iVar2 != 0;
          }
          if ((bool)uVar7 == false) goto LAB_001991a7;
          buff_01 = p_Var4;
          iVar2 = atoi(&stack0xfffffffffffffbd8);
          buff_00 = HTS_Node_find(p_Var4,iVar2);
          if (buff_00 == (HTS_Node *)0x0) {
            uVar3 = atoi(&stack0xfffffffffffffbd8);
            HTS_error(0,"HTS_Tree_load: Cannot find node %d.\n",(ulong)uVar3);
            HTS_Tree_clear((HTS_Tree *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            return '\0';
          }
          HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbd8,(char *)buff_00);
          if (HVar1 == '\0') {
            HTS_Tree_clear((HTS_Tree *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            return '\0';
          }
          pHVar5 = HTS_Question_find((HTS_Question *)p_Var4,(char *)0x198f75);
          buff_00->quest = pHVar5;
          if (buff_00->quest == (HTS_Question *)0x0) {
            HTS_error(0,"HTS_Tree_load: Cannot find question %s.\n",&stack0xfffffffffffffbd8);
            HTS_Tree_clear((HTS_Tree *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            return '\0';
          }
          p_Var4 = (_HTS_Node *)
                   HTS_calloc((size_t)buff_01,CONCAT17(uVar7,in_stack_fffffffffffffbc0));
          buff_00->yes = p_Var4;
          p_Var4 = (_HTS_Node *)
                   HTS_calloc((size_t)buff_01,CONCAT17(uVar7,in_stack_fffffffffffffbc0));
          buff_00->no = p_Var4;
          HTS_Node_initialize(buff_00->yes);
          HTS_Node_initialize(buff_00->no);
          HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbd8,(char *)buff_00);
          if (HVar1 == '\0') {
            buff_00->quest = (HTS_Question *)0x0;
            free(buff_00->yes);
            free(buff_00->no);
            HTS_Tree_clear((HTS_Tree *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            return '\0';
          }
          HVar1 = HTS_is_num((char *)buff_01);
          if (HVar1 == '\0') {
            sVar6 = HTS_name2num((char *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            buff_00->no->pdf = sVar6;
          }
          else {
            iVar2 = atoi(&stack0xfffffffffffffbd8);
            buff_00->no->index = iVar2;
          }
          buff_00->no->next = buff_01;
          p_Var4 = buff_00->no;
          HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbd8,(char *)buff_00);
          if (HVar1 == '\0') break;
          HVar1 = HTS_is_num((char *)p_Var4);
          if (HVar1 == '\0') {
            sVar6 = HTS_name2num((char *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
            buff_00->yes->pdf = sVar6;
          }
          else {
            iVar2 = atoi(&stack0xfffffffffffffbd8);
            buff_00->yes->index = iVar2;
          }
          buff_00->yes->next = p_Var4;
          p_Var4 = buff_00->yes;
        }
        buff_00->quest = (HTS_Question *)0x0;
        free(buff_00->yes);
        free(buff_00->no);
        HTS_Tree_clear((HTS_Tree *)CONCAT17(uVar7,in_stack_fffffffffffffbc0));
        local_1 = '\0';
      }
      else {
        sVar6 = HTS_name2num((char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
        buff_00->pdf = sVar6;
LAB_001991a7:
        local_1 = '\x01';
      }
    }
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Tree_load(HTS_Tree * tree, HTS_File * fp, HTS_Question * question)
{
   char buff[HTS_MAXBUFLEN];
   HTS_Node *node, *last_node;

   if (tree == NULL || fp == NULL)
      return FALSE;

   if (HTS_get_pattern_token(fp, buff) == FALSE) {
      HTS_Tree_clear(tree);
      return FALSE;
   }
   node = (HTS_Node *) HTS_calloc(1, sizeof(HTS_Node));
   HTS_Node_initialize(node);
   tree->root = last_node = node;

   if (strcmp(buff, "{") == 0) {
      while (HTS_get_pattern_token(fp, buff) == TRUE && strcmp(buff, "}") != 0) {
         node = HTS_Node_find(last_node, atoi(buff));
         if (node == NULL) {
            HTS_error(0, "HTS_Tree_load: Cannot find node %d.\n", atoi(buff));
            HTS_Tree_clear(tree);
            return FALSE;
         }
         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            HTS_Tree_clear(tree);
            return FALSE;
         }
         node->quest = HTS_Question_find(question, buff);
         if (node->quest == NULL) {
            HTS_error(0, "HTS_Tree_load: Cannot find question %s.\n", buff);
            HTS_Tree_clear(tree);
            return FALSE;
         }
         node->yes = (HTS_Node *) HTS_calloc(1, sizeof(HTS_Node));
         node->no = (HTS_Node *) HTS_calloc(1, sizeof(HTS_Node));
         HTS_Node_initialize(node->yes);
         HTS_Node_initialize(node->no);

         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            node->quest = NULL;
            free(node->yes);
            free(node->no);
            HTS_Tree_clear(tree);
            return FALSE;
         }
         if (HTS_is_num(buff))
            node->no->index = atoi(buff);
         else
            node->no->pdf = HTS_name2num(buff);
         node->no->next = last_node;
         last_node = node->no;

         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            node->quest = NULL;
            free(node->yes);
            free(node->no);
            HTS_Tree_clear(tree);
            return FALSE;
         }
         if (HTS_is_num(buff))
            node->yes->index = atoi(buff);
         else
            node->yes->pdf = HTS_name2num(buff);
         node->yes->next = last_node;
         last_node = node->yes;
      }
   } else {
      node->pdf = HTS_name2num(buff);
   }

   return TRUE;
}